

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_write_pagelist(Pager *pPager,PgHdr *pList)

{
  uint iPage;
  PgHdr *pPVar1;
  void *pBuf;
  char *pData;
  i64 offset;
  long lStack_28;
  Pgno pgno;
  sqlite3_int64 szFile;
  PgHdr *pPStack_18;
  int rc;
  PgHdr *pList_local;
  Pager *pPager_local;
  
  szFile._4_4_ = 0;
  pPStack_18 = pList;
  pList_local = (PgHdr *)pPager;
  if (pPager->fd->pMethods == (sqlite3_io_methods *)0x0) {
    szFile._4_4_ = pagerOpentemp(pPager,pPager->fd,pPager->vfsFlags);
  }
  if (((szFile._4_4_ == 0) &&
      (*(uint *)((long)&pList_local->pPager + 4) < *(uint *)&pList_local->pDirty)) &&
     ((pPStack_18->pDirty != (PgHdr *)0x0 ||
      (*(uint *)((long)&pList_local->pPager + 4) < pPStack_18->pgno)))) {
    lStack_28 = (long)pList_local[2].pDirtyNext * (ulong)*(uint *)&pList_local->pDirty;
    sqlite3OsFileControlHint((sqlite3_file *)pList_local[1].pPage,5,&stack0xffffffffffffffd8);
    *(undefined4 *)((long)&pList_local->pPager + 4) = *(undefined4 *)&pList_local->pDirty;
  }
  for (; szFile._4_4_ == 0 && pPStack_18 != (PgHdr *)0x0; pPStack_18 = pPStack_18->pDirty) {
    iPage = pPStack_18->pgno;
    if ((iPage <= *(uint *)&pList_local->pDirty) && ((pPStack_18->flags & 0x10) == 0)) {
      pPVar1 = pList_local[2].pDirtyNext;
      if (pPStack_18->pgno == 1) {
        pager_write_changecounter(pPStack_18);
      }
      pBuf = pPStack_18->pData;
      szFile._4_4_ = sqlite3OsWrite((sqlite3_file *)pList_local[1].pPage,pBuf,
                                    (int)pList_local[2].pDirtyNext,(ulong)(iPage - 1) * (long)pPVar1
                                   );
      if (iPage == 1) {
        pList_local[1].pDirtyPrev = *(PgHdr **)((long)pBuf + 0x18);
        pList_local[2].pPage = *(sqlite3_pcache_page **)((long)pBuf + 0x20);
      }
      if (*(uint *)&pList_local->pPager < iPage) {
        *(uint *)&pList_local->pPager = iPage;
      }
      *(int *)&pList_local[3].pPager = *(int *)&pList_local[3].pPager + 1;
      sqlite3BackupUpdate((sqlite3_backup *)pList_local[1].pPager,iPage,(u8 *)pPStack_18->pData);
    }
  }
  return szFile._4_4_;
}

Assistant:

static int pager_write_pagelist(Pager *pPager, PgHdr *pList){
  int rc = SQLITE_OK;                  /* Return code */

  /* This function is only called for rollback pagers in WRITER_DBMOD state. */
  assert( !pagerUseWal(pPager) );
  assert( pPager->tempFile || pPager->eState==PAGER_WRITER_DBMOD );
  assert( pPager->eLock==EXCLUSIVE_LOCK );
  assert( isOpen(pPager->fd) || pList->pDirty==0 );

  /* If the file is a temp-file has not yet been opened, open it now. It
  ** is not possible for rc to be other than SQLITE_OK if this branch
  ** is taken, as pager_wait_on_lock() is a no-op for temp-files.
  */
  if( !isOpen(pPager->fd) ){
    assert( pPager->tempFile && rc==SQLITE_OK );
    rc = pagerOpentemp(pPager, pPager->fd, pPager->vfsFlags);
  }

  /* Before the first write, give the VFS a hint of what the final
  ** file size will be.
  */
  assert( rc!=SQLITE_OK || isOpen(pPager->fd) );
  if( rc==SQLITE_OK
   && pPager->dbHintSize<pPager->dbSize
   && (pList->pDirty || pList->pgno>pPager->dbHintSize)
  ){
    sqlite3_int64 szFile = pPager->pageSize * (sqlite3_int64)pPager->dbSize;
    sqlite3OsFileControlHint(pPager->fd, SQLITE_FCNTL_SIZE_HINT, &szFile);
    pPager->dbHintSize = pPager->dbSize;
  }

  while( rc==SQLITE_OK && pList ){
    Pgno pgno = pList->pgno;

    /* If there are dirty pages in the page cache with page numbers greater
    ** than Pager.dbSize, this means sqlite3PagerTruncateImage() was called to
    ** make the file smaller (presumably by auto-vacuum code). Do not write
    ** any such pages to the file.
    **
    ** Also, do not write out any page that has the PGHDR_DONT_WRITE flag
    ** set (set by sqlite3PagerDontWrite()).
    */
    if( pgno<=pPager->dbSize && 0==(pList->flags&PGHDR_DONT_WRITE) ){
      i64 offset = (pgno-1)*(i64)pPager->pageSize;   /* Offset to write */
      char *pData;                                   /* Data to write */

      assert( (pList->flags&PGHDR_NEED_SYNC)==0 );
      if( pList->pgno==1 ) pager_write_changecounter(pList);

      pData = pList->pData;

      /* Write out the page data. */
      rc = sqlite3OsWrite(pPager->fd, pData, pPager->pageSize, offset);

      /* If page 1 was just written, update Pager.dbFileVers to match
      ** the value now stored in the database file. If writing this
      ** page caused the database file to grow, update dbFileSize.
      */
      if( pgno==1 ){
        memcpy(&pPager->dbFileVers, &pData[24], sizeof(pPager->dbFileVers));
      }
      if( pgno>pPager->dbFileSize ){
        pPager->dbFileSize = pgno;
      }
      pPager->aStat[PAGER_STAT_WRITE]++;

      /* Update any backup objects copying the contents of this pager. */
      sqlite3BackupUpdate(pPager->pBackup, pgno, (u8*)pList->pData);

      PAGERTRACE(("STORE %d page %d hash(%08x)\n",
                   PAGERID(pPager), pgno, pager_pagehash(pList)));
      IOTRACE(("PGOUT %p %d\n", pPager, pgno));
      PAGER_INCR(sqlite3_pager_writedb_count);
    }else{
      PAGERTRACE(("NOSTORE %d page %d\n", PAGERID(pPager), pgno));
    }
    pager_set_pagehash(pList);
    pList = pList->pDirty;
  }

  return rc;
}